

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

Elf64_Verdef * __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::GetVerdef(ElfMemImage *this,int index)

{
  Elf64_Verdef *pEVar1;
  char *version_definition_as_char;
  Elf64_Verdef *pEVar2;
  
  if ((-1 < index) && ((ulong)(uint)index <= this->verdefnum_)) {
    for (pEVar2 = this->verdef_;
        ((uint)pEVar2->vd_ndx < (uint)index && ((ulong)pEVar2->vd_next != 0));
        pEVar2 = (Elf64_Verdef *)((long)&pEVar2->vd_version + (ulong)pEVar2->vd_next)) {
    }
    pEVar1 = (Elf64_Verdef *)0x0;
    if ((uint)pEVar2->vd_ndx == index) {
      pEVar1 = pEVar2;
    }
    return pEVar1;
  }
  raw_log_internal::RawLog
            (kFatal,"elf_mem_image.cc",0x7e,"Check %s failed: %s",
             "0 <= index && static_cast<size_t>(index) <= verdefnum_","index out of range");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                ,0x7e,
                "const Elf64_Verdef *absl::debugging_internal::ElfMemImage::GetVerdef(int) const");
}

Assistant:

const ElfW(Verdef) *ElfMemImage::GetVerdef(int index) const {
  ABSL_RAW_CHECK(0 <= index && static_cast<size_t>(index) <= verdefnum_,
                 "index out of range");
  const ElfW(Verdef) *version_definition = verdef_;
  while (version_definition->vd_ndx < index && version_definition->vd_next) {
    const char *const version_definition_as_char =
        reinterpret_cast<const char *>(version_definition);
    version_definition =
        reinterpret_cast<const ElfW(Verdef) *>(version_definition_as_char +
                                               version_definition->vd_next);
  }
  return version_definition->vd_ndx == index ? version_definition : nullptr;
}